

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O1

size_t fiobj_json2obj(FIOBJ *pobj,void *data,size_t len)

{
  size_t sVar1;
  FIOBJ o;
  fiobj_json_parser_s p;
  json_parser_s local_58;
  FIOBJ FStack_50;
  FIOBJ local_48;
  undefined8 uStack_40;
  long local_38;
  long lStack_30;
  undefined8 local_28;
  void *pvStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  pvStack_20 = (void *)0x0;
  local_38 = 0;
  lStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58.dict = 0;
  local_58.depth = '\0';
  local_58.key = '\0';
  local_58._6_2_ = 0;
  FStack_50 = 0;
  local_18 = 0;
  sVar1 = fio_json_parse(&local_58,(char *)data,len);
  if ((sVar1 == 0) || (local_58.depth != '\0')) {
    if (lStack_30 == local_38) {
      o = 0;
    }
    else {
      o = *(FIOBJ *)((long)pvStack_20 + local_38 * 8);
    }
    fiobj_free(o);
    local_48 = 0;
  }
  fio_free(pvStack_20);
  local_28 = 0;
  pvStack_20 = (void *)0x0;
  local_38 = 0;
  lStack_30 = 0;
  fiobj_free(FStack_50);
  *pobj = local_48;
  return sVar1;
}

Assistant:

size_t fiobj_json2obj(FIOBJ *pobj, const void *data, size_t len) {
  fiobj_json_parser_s p = {.top = FIOBJ_INVALID};
  size_t consumed = fio_json_parse(&p.p, data, len);
  if (!consumed || p.p.depth) {
    fiobj_free(fio_json_stack_get(&p.stack, 0));
    p.top = FIOBJ_INVALID;
  }
  fio_json_stack_free(&p.stack);
  fiobj_free(p.key);
  *pobj = p.top;
  return consumed;
}